

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_group.hpp
# Opt level: O0

void __thiscall
oqpi::
task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::activeWait(task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             *this)

{
  eAssertResult eVar1;
  void *in_RSI;
  eAssertResult assertResult;
  task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *this_local;
  
  if (!activeWait::always_ignore) {
    in_RSI = (void *)0x4d;
    eVar1 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task_group.hpp"
                            ,0x4d,"(false)","Not supported, fall back to wait");
    if (eVar1 == eAR_Retry) {
      debugger_break();
    }
    else if (eVar1 == eAR_AlwaysIgnore) {
      activeWait::always_ignore = true;
    }
  }
  wait(this,in_RSI);
  return;
}

Assistant:

virtual void activeWait() override
        {
            oqpi_checkf(false, "Not supported, fall back to wait");
            wait();
        }